

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord3d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord3d *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  anon_struct_8_0_00000001_for___align local_81;
  double dStack_79;
  double local_71;
  optional<tinyusdz::value::texcoord3d> local_60;
  anon_struct_8_0_00000001_for___align local_39;
  double dStack_31;
  double local_29;
  
  if (v == (texcoord3d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::texcoord3d>(&local_60,this);
    if (local_60.has_value_ == true) {
      local_29 = (double)local_60.contained._16_8_;
      local_39 = local_60.contained.data.__align;
      dStack_31 = (double)local_60.contained._8_8_;
      local_81 = local_60.contained.data.__align;
      dStack_79 = (double)local_60.contained._8_8_;
      local_71 = (double)local_60.contained._16_8_;
    }
    if (local_60.has_value_ != false) goto LAB_004e5ca8;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord3d,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::texcoord3d>(&local_60,this);
    if (local_60.has_value_ == true) {
      local_81 = local_60.contained.data.__align;
      dStack_79 = (double)local_60.contained._8_8_;
      local_71 = (double)local_60.contained._16_8_;
    }
    if (local_60.has_value_ != false) {
LAB_004e5ca8:
      v->r = local_71;
      v->s = (double)local_81;
      v->t = dStack_79;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }